

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void absl::lts_20250127::CopyCordToString(Cord *src,Nonnull<std::string_*> dst)

{
  bool bVar1;
  size_t new_size;
  Nonnull<char_*> dst_00;
  Nonnull<std::string_*> dst_local;
  Cord *src_local;
  
  bVar1 = Cord::InlineRep::is_tree(&src->contents_);
  if (bVar1) {
    new_size = Cord::size(src);
    strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>(dst,new_size);
    dst_00 = (Nonnull<char_*>)std::__cxx11::string::operator[]((ulong)dst);
    Cord::CopyToArraySlowPath(src,dst_00);
  }
  else {
    Cord::InlineRep::CopyTo(&src->contents_,dst);
  }
  return;
}

Assistant:

void CopyCordToString(const Cord& src, absl::Nonnull<std::string*> dst) {
  if (!src.contents_.is_tree()) {
    src.contents_.CopyTo(dst);
  } else {
    absl::strings_internal::STLStringResizeUninitialized(dst, src.size());
    src.CopyToArraySlowPath(&(*dst)[0]);
  }
}